

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O3

SelectionFlags __thiscall
QAbstractItemViewPrivate::multiSelectionCommand
          (QAbstractItemViewPrivate *this,QModelIndex *index,QEvent *event)

{
  char cVar1;
  ulong uVar2;
  QFlagsStorage<QItemSelectionModel::SelectionFlag> QVar3;
  QFlagsStorage<QItemSelectionModel::SelectionFlag> QVar4;
  bool bVar5;
  
  if (event == (QEvent *)0x0) goto LAB_0053c235;
  QVar4.i = 0;
  switch(*(undefined2 *)(event + 8)) {
  case 2:
    if (*(int *)(event + 0x40) != 1) {
      return (SelectionFlags)0;
    }
    if (((this->pressedAlreadySelected == true) && (this->dragEnabled == true)) &&
       (uVar2 = (**(code **)(*(long *)this->model + 0x138))(this->model,index), (uVar2 & 4) != 0)) {
      return (SelectionFlags)0;
    }
    goto LAB_0053c235;
  case 3:
    if (*(int *)(event + 0x40) != 1) {
      return (SelectionFlags)0;
    }
    if ((((this->pressedAlreadySelected == true) && (this->dragEnabled == true)) &&
        (uVar2 = (**(code **)(*(long *)this->model + 0x138))(this->model,index), (uVar2 & 4) != 0))
       && (cVar1 = comparesEqual(&this->pressedIndex,index), cVar1 != '\0')) goto LAB_0053c235;
    QVar3.i = (uint)(this->selectionBehavior == SelectColumns) << 6;
    bVar5 = this->selectionBehavior == SelectRows;
    QVar4.i = 0x20;
    break;
  default:
    goto switchD_0053c153_caseD_4;
  case 5:
    if (((byte)event[0x44] & 1) == 0) {
      return (SelectionFlags)0;
    }
    QVar3.i = (uint)(this->selectionBehavior == SelectColumns) << 6 | 0x18;
    bVar5 = this->selectionBehavior == SelectRows;
    QVar4.i = 0x38;
    break;
  case 6:
    if ((*(int *)(event + 0x40) != 0x1010000) && (*(int *)(event + 0x40) != 0x20)) {
      return (SelectionFlags)0;
    }
LAB_0053c235:
    QVar3.i = (uint)(this->selectionBehavior == SelectColumns) << 6 | 8;
    bVar5 = this->selectionBehavior == SelectRows;
    QVar4.i = 0x28;
  }
  if (!bVar5) {
    QVar4.i = QVar3.i;
  }
switchD_0053c153_caseD_4:
  return (QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>)
         (QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>)QVar4.i;
}

Assistant:

QItemSelectionModel::SelectionFlags QAbstractItemViewPrivate::multiSelectionCommand(
    const QModelIndex &index, const QEvent *event) const
{
    Q_UNUSED(index);

    if (event) {
        switch (event->type()) {
        case QEvent::KeyPress:
            if (static_cast<const QKeyEvent*>(event)->key() == Qt::Key_Space
             || static_cast<const QKeyEvent*>(event)->key() == Qt::Key_Select)
                return QItemSelectionModel::Toggle|selectionBehaviorFlags();
            break;
        case QEvent::MouseButtonPress:
            if (static_cast<const QMouseEvent*>(event)->button() == Qt::LeftButton) {
                // since the press might start a drag, deselect only on release
                if (!pressedAlreadySelected
#if QT_CONFIG(draganddrop)
                        || !dragEnabled || !isIndexDragEnabled(index)
#endif
                        )
                    return QItemSelectionModel::Toggle|selectionBehaviorFlags(); // toggle
            }
            break;
        case QEvent::MouseButtonRelease:
            if (static_cast<const QMouseEvent*>(event)->button() == Qt::LeftButton) {
                if (pressedAlreadySelected
#if QT_CONFIG(draganddrop)
                        && dragEnabled && isIndexDragEnabled(index)
#endif
                        && index == pressedIndex)
                    return QItemSelectionModel::Toggle|selectionBehaviorFlags();
                return QItemSelectionModel::NoUpdate|selectionBehaviorFlags(); // finalize
            }
            break;
        case QEvent::MouseMove:
            if (static_cast<const QMouseEvent*>(event)->buttons() & Qt::LeftButton)
                return QItemSelectionModel::ToggleCurrent|selectionBehaviorFlags(); // toggle drag select
            break;
        default:
            break;
        }
        return QItemSelectionModel::NoUpdate;
    }

    return QItemSelectionModel::Toggle|selectionBehaviorFlags();
}